

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateCast(ExpressionTranslateContext *ctx,ExprTypeCast *expression)

{
  uint uVar1;
  TypeBase *pTVar2;
  _func_int **pp_Var3;
  char *pcVar4;
  TypeBase *pTVar5;
  
  switch(expression->category) {
  case EXPR_CAST_NUMERICAL:
switchD_0014ef29_caseD_0:
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    pcVar4 = ")(";
    goto LAB_0014f331;
  case EXPR_CAST_PTR_TO_BOOL:
    Print(ctx,"(!!(");
    Translate(ctx,expression->value);
    pcVar4 = "))";
    break;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    Print(ctx,"((");
    Translate(ctx,expression->value);
    pcVar4 = ").ptr != 0)";
    break;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    Print(ctx,"((");
    Translate(ctx,expression->value);
    pcVar4 = ").id != 0)";
    break;
  case EXPR_CAST_NULL_TO_PTR:
    pTVar5 = (expression->super_ExprBase).type;
    if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
      return;
    }
    Print(ctx,"(");
    TranslateTypeName(ctx,(TypeBase *)pTVar5[1]._vptr_TypeBase);
    pcVar4 = "*)0";
    break;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pcVar4 = "__nullcMakeAutoRef(0, 0)";
    break;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pTVar5 = (expression->super_ExprBase).type;
    if (pTVar5 == (TypeBase *)0x0) {
      return;
    }
    if (pTVar5->typeID != 0x14) {
      return;
    }
    Print(ctx,"NULLCArray< ");
    TranslateTypeName(ctx,*(TypeBase **)&pTVar5[1].typeIndex);
    pcVar4 = " >()";
    break;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pcVar4 = "__makeAutoArray(0, NULLCArray<void>())";
    break;
  case EXPR_CAST_NULL_TO_FUNCTION:
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    pcVar4 = "()";
    break;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar5 = expression->value->type;
    if (pTVar5 == (TypeBase *)0x0) {
      return;
    }
    if (pTVar5->typeID != 0x12) {
      return;
    }
    pp_Var3 = pTVar5[1]._vptr_TypeBase;
    if ((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x13)) {
      __assert_fail("typeArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x278,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
    }
    if (*(int *)((long)pp_Var3 + 0x6c) != 0) {
      __assert_fail("unsigned(typeArray->length) == typeArray->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x279,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
    }
    Print(ctx,"__makeNullcArray< ");
    TranslateTypeName(ctx,(TypeBase *)pp_Var3[0xc]);
    Print(ctx," >(");
    Translate(ctx,expression->value);
    uVar1 = *(uint *)(pp_Var3 + 0xd);
    pcVar4 = ", %d)";
    goto LAB_0014f31b;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar5 = expression->value->type;
    if (pTVar5 == (TypeBase *)0x0) {
      return;
    }
    if (pTVar5->typeID != 0x12) {
      return;
    }
    pp_Var3 = pTVar5[1]._vptr_TypeBase;
    if (((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x18)) ||
       ((*(char *)(pp_Var3 + 0x22) == '\0' && (pp_Var3[0x23] == (_func_int *)0x0)))) {
      pcVar4 = "__nullcMakeAutoRef(";
      goto LAB_0014f2f7;
    }
    pcVar4 = "__nullcMakeExtendableAutoRef(";
    goto LAB_0014f331;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar5 = (expression->super_ExprBase).type;
    if (pTVar5 == (TypeBase *)0x0) {
      return;
    }
    if (pTVar5->typeID != 0x12) {
      return;
    }
    Print(ctx,"(");
    TranslateTypeName(ctx,(TypeBase *)pTVar5[1]._vptr_TypeBase);
    pcVar4 = "*)__nullcGetAutoRef(";
LAB_0014f2f7:
    Print(ctx,pcVar4);
    Translate(ctx,expression->value);
    uVar1 = *(uint *)(pTVar5[1]._vptr_TypeBase + 5);
    pcVar4 = ", __nullcTR[%d])";
LAB_0014f31b:
    Print(ctx,pcVar4,(ulong)uVar1);
    return;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar5 = expression->value->type;
    if (pTVar5 == (TypeBase *)0x0) {
      return;
    }
    if (pTVar5->typeID != 0x14) {
      return;
    }
    Print(ctx,"__makeAutoArray(__nullcTR[%d], ",
          (ulong)*(uint *)(*(long *)&pTVar5[1].typeIndex + 0x28));
    goto LAB_0014f33b;
  case EXPR_CAST_REINTERPRET:
    pTVar5 = (expression->super_ExprBase).type;
    if ((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0x14)) {
      pTVar2 = expression->value->type;
      if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x14)) {
        Translate(ctx,expression->value);
        return;
      }
    }
    pTVar2 = ctx->ctx->typeInt;
    if ((pTVar5 == pTVar2) && (expression->value->type == ctx->ctx->typeTypeID)) {
      pcVar4 = "(int)(";
    }
    else {
      if ((pTVar5 == (TypeBase *)0x0) ||
         ((pTVar5->typeID != 0x19 || (expression->value->type != pTVar2)))) {
        if (pTVar5 == pTVar2) {
          pTVar2 = expression->value->type;
          if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
            Translate(ctx,expression->value);
            pcVar4 = ".value";
            break;
          }
        }
        if (pTVar5 == (TypeBase *)0x0) {
LAB_0014f35d:
          __assert_fail("!\"unknown cast\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x2cf,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
        }
        if (pTVar5->typeID != 0x15) {
          if (((pTVar5->typeID != 0x12) ||
              (pTVar5 = expression->value->type, pTVar5 == (TypeBase *)0x0)) ||
             (pTVar5->typeID != 0x12)) goto LAB_0014f35d;
          goto switchD_0014ef29_caseD_0;
        }
        pTVar2 = expression->value->type;
        if ((pTVar2 == (TypeBase *)0x0) || (pTVar2->typeID != 0x15)) goto LAB_0014f35d;
      }
      TranslateTypeName(ctx,pTVar5);
      pcVar4 = "(";
    }
LAB_0014f331:
    Print(ctx,pcVar4);
LAB_0014f33b:
    Translate(ctx,expression->value);
    pcVar4 = ")";
    break;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x2d3,"void TranslateCast(ExpressionTranslateContext &, ExprTypeCast *)");
  }
  Print(ctx,pcVar4);
  return;
}

Assistant:

void TranslateCast(ExpressionTranslateContext &ctx, ExprTypeCast *expression)
{
	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")(");
		Translate(ctx, expression->value);
		Print(ctx, ")");
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		Print(ctx, "(!!(");
		Translate(ctx, expression->value);
		Print(ctx, "))");
		break;
	case EXPR_CAST_UNSIZED_TO_BOOL:
		Print(ctx, "((");
		Translate(ctx, expression->value);
		Print(ctx, ").ptr != 0)");
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		Print(ctx, "((");
		Translate(ctx, expression->value);
		Print(ctx, ").id != 0)");
		break;
	case EXPR_CAST_NULL_TO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, typeRef->subType);
			Print(ctx, "*)0");
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		Print(ctx, "__nullcMakeAutoRef(0, 0)");
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(expression->type))
		{
			Print(ctx, "NULLCArray< ");
			TranslateTypeName(ctx, typeUnsizedArray->subType);
			Print(ctx, " >()");
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		Print(ctx, "__makeAutoArray(0, NULLCArray<void>())");
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		TranslateTypeName(ctx, expression->type);
		Print(ctx, "()");
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *typeRef = getType<TypeRef>(expression->value->type))
		{
			TypeArray *typeArray = getType<TypeArray>(typeRef->subType);

			assert(typeArray);
			assert(unsigned(typeArray->length) == typeArray->length);

			Print(ctx, "__makeNullcArray< ");
			TranslateTypeName(ctx, typeArray->subType);
			Print(ctx, " >(");
			Translate(ctx, expression->value);
			Print(ctx, ", %d)", (unsigned)typeArray->length);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->value->type))
		{
			TypeClass *classType = getType<TypeClass>(typeRef->subType);

			if(classType && (classType->extendable || classType->baseClass))
			{
				Print(ctx, "__nullcMakeExtendableAutoRef(");
				Translate(ctx, expression->value);
				Print(ctx, ")");
			}
			else
			{
				Print(ctx, "__nullcMakeAutoRef(");
				Translate(ctx, expression->value);
				Print(ctx, ", __nullcTR[%d])", typeRef->subType->typeIndex);
			}
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *typeRef = getType<TypeRef>(expression->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, typeRef->subType);
			Print(ctx, "*)__nullcGetAutoRef(");
			Translate(ctx, expression->value);
			Print(ctx, ", __nullcTR[%d])", typeRef->subType->typeIndex);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(expression->value->type))
		{
			Print(ctx, "__makeAutoArray(__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(expression->value->type))
		{
			Translate(ctx, expression->value);
		}
		else if(expression->type == ctx.ctx.typeInt && expression->value->type == ctx.ctx.typeTypeID)
		{
			Print(ctx, "(int)(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(isType<TypeEnum>(expression->type) && expression->value->type == ctx.ctx.typeInt)
		{
			TranslateTypeName(ctx, expression->type);
			Print(ctx, "(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(expression->type == ctx.ctx.typeInt && isType<TypeEnum>(expression->value->type))
		{
			Translate(ctx, expression->value);
			Print(ctx, ".value");
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(expression->value->type))
		{
			Print(ctx, "(");
			TranslateTypeName(ctx, expression->type);
			Print(ctx, ")(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(expression->value->type))
		{
			TranslateTypeName(ctx, expression->type);
			Print(ctx, "(");
			Translate(ctx, expression->value);
			Print(ctx, ")");
		}
		else
		{
			assert(!"unknown cast");
		}
		break;
	default:
		assert(!"unknown cast");
	}
}